

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::FileGenerator::GenerateDescriptorInitializationCodeForImmutable
          (FileGenerator *this,Printer *printer)

{
  ClassNameResolver *this_00;
  int iVar1;
  scoped_ptr<google::protobuf::compiler::java::MessageGenerator> *this_01;
  MessageGenerator *pMVar2;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *this_02;
  ExtensionGenerator *pEVar3;
  GeneratorFactory *pGVar4;
  undefined4 extraout_var;
  _Base_ptr p_Var5;
  FileDescriptor *pFVar6;
  int i;
  long lVar7;
  int i_1;
  int bytecode_estimate;
  int method_num;
  scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> generator;
  string file_data;
  FieldDescriptorSet extensions;
  FileDescriptorProto file_proto;
  SharedCodeGenerator shared_code_generator;
  int local_1d8 [2];
  string local_1d0;
  string local_1b0;
  FieldDescriptorSet local_190;
  FileDescriptorProto local_160;
  SharedCodeGenerator local_88;
  
  std::__cxx11::string::string((string *)&local_160,"",(allocator *)&local_88);
  io::Printer::Print(printer,
                     "public static com.google.protobuf.Descriptors.FileDescriptor\n    getDescriptor() {\n  return descriptor;\n}\nprivate static $final$ com.google.protobuf.Descriptors.FileDescriptor\n    descriptor;\nstatic {\n"
                     ,"final",(string *)&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  io::Printer::Indent(printer);
  SharedCodeGenerator::SharedCodeGenerator(&local_88,this->file_,&this->options_);
  SharedCodeGenerator::GenerateDescriptors(&local_88,printer);
  local_1d8[0] = 0;
  local_1d8[1] = 0;
  for (lVar7 = 0; pFVar6 = this->file_, lVar7 < *(int *)(pFVar6 + 0x58); lVar7 = lVar7 + 1) {
    this_01 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>_>
              ::operator[](&this->message_generators_,lVar7);
    pMVar2 = internal::scoped_ptr<google::protobuf::compiler::java::MessageGenerator>::operator->
                       (this_01);
    iVar1 = (*pMVar2->_vptr_MessageGenerator[3])(pMVar2,printer);
    local_1d8[0] = local_1d8[0] + iVar1;
    anon_unknown_0::MaybeRestartJavaMethod
              (printer,local_1d8,local_1d8 + 1,"_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (lVar7 = 0; lVar7 < *(int *)(pFVar6 + 0x88); lVar7 = lVar7 + 1) {
    this_02 = internal::
              scoped_array<google::protobuf::internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>_>
              ::operator[](&this->extension_generators_,lVar7);
    pEVar3 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::operator->
                       (this_02);
    iVar1 = (*pEVar3->_vptr_ExtensionGenerator[3])(pEVar3,printer);
    local_1d8[0] = local_1d8[0] + iVar1;
    anon_unknown_0::MaybeRestartJavaMethod
              (printer,local_1d8,local_1d8 + 1,"_clinit_autosplit_dinit_$method_num$();\n",
               "private static void _clinit_autosplit_dinit_$method_num$() {\n");
    pFVar6 = this->file_;
  }
  FileDescriptorProto::FileDescriptorProto(&local_160);
  FileDescriptor::CopyTo(this->file_,&local_160);
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_local_buf[0] = '\0';
  MessageLite::SerializeToString((MessageLite *)&local_160,&local_1b0);
  local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_190._M_t._M_impl.super__Rb_tree_header._M_header;
  local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_190._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  anon_unknown_0::CollectExtensions
            (&local_160,*(DescriptorPool **)(this->file_ + 0x10),&local_190,&local_1b0);
  if (local_190._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    io::Printer::Print(printer,
                       "com.google.protobuf.ExtensionRegistry registry =\n    com.google.protobuf.ExtensionRegistry.newInstance();\n"
                      );
    for (p_Var5 = local_190._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var5 != &local_190._M_t._M_impl.super__Rb_tree_header;
        p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
      pGVar4 = internal::scoped_ptr<google::protobuf::compiler::java::GeneratorFactory>::operator->
                         (&this->generator_factory_);
      iVar1 = (*pGVar4->_vptr_GeneratorFactory[3])(pGVar4,*(undefined8 *)(p_Var5 + 1));
      local_1d0._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar1);
      pEVar3 = internal::scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator>::
               operator->((scoped_ptr<google::protobuf::compiler::java::ExtensionGenerator> *)
                          &local_1d0);
      iVar1 = (*pEVar3->_vptr_ExtensionGenerator[4])(pEVar3,printer);
      local_1d8[0] = local_1d8[0] + iVar1;
      anon_unknown_0::MaybeRestartJavaMethod
                (printer,local_1d8,local_1d8 + 1,"_clinit_autosplit_dinit_$method_num$(registry);\n"
                 ,
                 "private static void _clinit_autosplit_dinit_$method_num$(\n    com.google.protobuf.ExtensionRegistry registry) {\n"
                );
      if ((long *)local_1d0._M_dataplus._M_p != (long *)0x0) {
        (**(code **)(*(long *)local_1d0._M_dataplus._M_p + 8))();
      }
    }
    io::Printer::Print(printer,
                       "com.google.protobuf.Descriptors.FileDescriptor\n    .internalUpdateFileDescriptor(descriptor, registry);\n"
                      );
  }
  for (iVar1 = 0; iVar1 < *(int *)(this->file_ + 0x18); iVar1 = iVar1 + 1) {
    FileDescriptor::dependency(this->file_,iVar1);
    this_00 = this->name_resolver_;
    pFVar6 = FileDescriptor::dependency(this->file_,iVar1);
    ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
              (&local_1d0,this_00,pFVar6);
    io::Printer::Print(printer,"$dependency$.getDescriptor();\n","dependency",&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
  }
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"}\n");
  std::
  set<const_google::protobuf::FieldDescriptor_*,_google::protobuf::compiler::java::(anonymous_namespace)::FieldDescriptorCompare,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~set(&local_190);
  std::__cxx11::string::~string((string *)&local_1b0);
  FileDescriptorProto::~FileDescriptorProto(&local_160);
  SharedCodeGenerator::~SharedCodeGenerator(&local_88);
  return;
}

Assistant:

void FileGenerator::GenerateDescriptorInitializationCodeForImmutable(
    io::Printer* printer) {
  printer->Print(
    "public static com.google.protobuf.Descriptors.FileDescriptor\n"
    "    getDescriptor() {\n"
    "  return descriptor;\n"
    "}\n"
    "private static $final$ com.google.protobuf.Descriptors.FileDescriptor\n"
    "    descriptor;\n"
    "static {\n",
    // TODO(dweis): Mark this as final.
    "final", "");
  printer->Indent();

  SharedCodeGenerator shared_code_generator(file_, options_);
  shared_code_generator.GenerateDescriptors(printer);

  int bytecode_estimate = 0;
  int method_num = 0;

  for (int i = 0; i < file_->message_type_count(); i++) {
    bytecode_estimate += message_generators_[i]->GenerateStaticVariableInitializers(printer);
    MaybeRestartJavaMethod(
      printer,
      &bytecode_estimate, &method_num,
      "_clinit_autosplit_dinit_$method_num$();\n",
      "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }
  for (int i = 0; i < file_->extension_count(); i++) {
    bytecode_estimate += extension_generators_[i]->GenerateNonNestedInitializationCode(printer);
    MaybeRestartJavaMethod(
      printer,
      &bytecode_estimate, &method_num,
      "_clinit_autosplit_dinit_$method_num$();\n",
      "private static void _clinit_autosplit_dinit_$method_num$() {\n");
  }

  // Proto compiler builds a DescriptorPool, which holds all the descriptors to
  // generate, when processing the ".proto" files. We call this DescriptorPool
  // the parsed pool (a.k.a. file_->pool()).
  //
  // Note that when users try to extend the (.*)DescriptorProto in their
  // ".proto" files, it does not affect the pre-built FileDescriptorProto class
  // in proto compiler. When we put the descriptor data in the file_proto, those
  // extensions become unknown fields.
  //
  // Now we need to find out all the extension value to the (.*)DescriptorProto
  // in the file_proto message, and prepare an ExtensionRegistry to return.
  //
  // To find those extensions, we need to parse the data into a dynamic message
  // of the FileDescriptor based on the builder-pool, then we can use
  // reflections to find all extension fields
  FileDescriptorProto file_proto;
  file_->CopyTo(&file_proto);
  string file_data;
  file_proto.SerializeToString(&file_data);
  FieldDescriptorSet extensions;
  CollectExtensions(file_proto, *file_->pool(), &extensions, file_data);

  if (extensions.size() > 0) {
    // Must construct an ExtensionRegistry containing all existing extensions
    // and use it to parse the descriptor data again to recognize extensions.
    printer->Print(
      "com.google.protobuf.ExtensionRegistry registry =\n"
      "    com.google.protobuf.ExtensionRegistry.newInstance();\n");
    FieldDescriptorSet::iterator it;
    for (it = extensions.begin(); it != extensions.end(); it++) {
      google::protobuf::scoped_ptr<ExtensionGenerator> generator(
          generator_factory_->NewExtensionGenerator(*it));
      bytecode_estimate += generator->GenerateRegistrationCode(printer);
      MaybeRestartJavaMethod(
        printer,
        &bytecode_estimate, &method_num,
        "_clinit_autosplit_dinit_$method_num$(registry);\n",
        "private static void _clinit_autosplit_dinit_$method_num$(\n"
        "    com.google.protobuf.ExtensionRegistry registry) {\n");
    }
    printer->Print(
      "com.google.protobuf.Descriptors.FileDescriptor\n"
      "    .internalUpdateFileDescriptor(descriptor, registry);\n");
  }

  // Force descriptor initialization of all dependencies.
  for (int i = 0; i < file_->dependency_count(); i++) {
    if (ShouldIncludeDependency(file_->dependency(i), true)) {
      string dependency =
          name_resolver_->GetImmutableClassName(file_->dependency(i));
      printer->Print(
        "$dependency$.getDescriptor();\n",
        "dependency", dependency);
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n");
}